

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

void __thiscall
node::ImportBlocks(node *this,ChainstateManager *chainman,
                  span<const_fs::path,_18446744073709551615UL> import_paths)

{
  long *plVar1;
  vector<std::byte,_std::allocator<std::byte>_> data_xor;
  bool bVar2;
  Chainstate *this_00;
  FILE *file_00;
  char *args;
  pointer ppVar3;
  uint uVar4;
  long lVar5;
  pointer ppCVar6;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  shared_ptr<const_CBlock> pblock;
  string_view source_file_03;
  string_view source_file_04;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  undefined8 in_stack_fffffffffffffe68;
  pointer in_stack_fffffffffffffe70;
  BlockManager *in_stack_fffffffffffffe78;
  undefined1 local_178 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_170 [2];
  _Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_> local_160;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_148;
  ImportingNow imp;
  undefined1 local_120 [32];
  FlatFilePos pos;
  AutoFile file;
  multimap<uint256,_FlatFilePos,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_FlatFilePos>_>_>
  blocks_with_unknown_parent;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  ppVar3 = import_paths._M_ptr;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ImportingNow::ImportingNow(&imp,(atomic<bool> *)(this + 0x9d0));
  if (((byte)this[0x9d1] & 1) == 0) {
    blocks_with_unknown_parent._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &blocks_with_unknown_parent._M_t._M_impl.super__Rb_tree_header._M_header;
    blocks_with_unknown_parent._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         blocks_with_unknown_parent._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
         0xffffffff00000000;
    blocks_with_unknown_parent._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    in_stack_fffffffffffffe78 = (BlockManager *)(this + 0x7f8);
    blocks_with_unknown_parent._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    uVar4 = 0;
    blocks_with_unknown_parent._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         blocks_with_unknown_parent._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while( true ) {
      pos.nPos = 0;
      pos.nFile = uVar4;
      FlatFileSeq::FileName((path *)&file,(FlatFileSeq *)(this + 0x958),&pos);
      bVar2 = std::filesystem::exists((path *)&file);
      std::filesystem::__cxx11::path::~path((path *)&file);
      if (!bVar2) break;
      BlockManager::OpenBlockFile(&file,in_stack_fffffffffffffe78,&pos,true);
      if (file.m_file == (FILE *)0x0) {
        AutoFile::~AutoFile(&file);
        break;
      }
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
      ;
      source_file._M_len = 0x65;
      logging_function._M_str = "ImportBlocks";
      logging_function._M_len = 0xc;
      local_120._0_4_ = uVar4;
      LogPrintFormatInternal<unsigned_int>
                (logging_function,source_file,0x4c8,ALL,Info,(ConstevalFormatString<1U>)0xc9e30d,
                 (uint *)local_120);
      ChainstateManager::LoadExternalBlockFile
                ((ChainstateManager *)this,&file,&pos,&blocks_with_unknown_parent);
      bVar2 = util::SignalInterrupt::operator_cast_to_bool(*(SignalInterrupt **)(this + 0x720));
      if (bVar2) {
        source_file_04._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
        ;
        source_file_04._M_len = 0x65;
        logging_function_04._M_str = "ImportBlocks";
        logging_function_04._M_len = 0xc;
        LogPrintFormatInternal<char[13]>
                  (logging_function_04,source_file_04,0x4cb,ALL,Info,
                   (ConstevalFormatString<1U>)0xc9e333,(char (*) [13])"ImportBlocks");
        AutoFile::~AutoFile(&file);
        std::
        _Rb_tree<uint256,_std::pair<const_uint256,_FlatFilePos>,_std::_Select1st<std::pair<const_uint256,_FlatFilePos>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_FlatFilePos>_>_>
        ::~_Rb_tree(&blocks_with_unknown_parent._M_t);
        goto LAB_0075fb6f;
      }
      uVar4 = uVar4 + 1;
      AutoFile::~AutoFile(&file);
    }
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&file,&cs_main,"::cs_main",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
               ,0x4d0,false);
    kernel::BlockTreeDB::WriteReindexing(*(BlockTreeDB **)(this + 0xa48),false);
    std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&file)
    ;
    LOCK();
    this[0x9d1] = (node)0x1;
    UNLOCK();
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file_00._M_len = 0x65;
    logging_function_00._M_str = "ImportBlocks";
    logging_function_00._M_len = 0xc;
    LogPrintFormatInternal<>
              (logging_function_00,source_file_00,0x4d2,ALL,Info,(ConstevalFormatString<0U>)0xc9e351
              );
    this_00 = ChainstateManager::ActiveChainstate((ChainstateManager *)this);
    Chainstate::LoadGenesisBlock(this_00);
    std::
    _Rb_tree<uint256,_std::pair<const_uint256,_FlatFilePos>,_std::_Select1st<std::pair<const_uint256,_FlatFilePos>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_FlatFilePos>_>_>
    ::~_Rb_tree(&blocks_with_unknown_parent._M_t);
    in_stack_fffffffffffffe70 = ppVar3;
  }
  for (lVar5 = (long)ppVar3 * 0x28; lVar5 != 0; lVar5 = lVar5 + -0x28) {
    file_00 = fsbridge::fopen((char *)chainman,"rb");
    local_148._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_148._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffe70;
    data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffe68;
    data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffe78;
    AutoFile::AutoFile((AutoFile *)&blocks_with_unknown_parent,(FILE *)file_00,data_xor);
    std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(&local_148);
    if (blocks_with_unknown_parent._M_t._M_impl._0_8_ == 0) {
      std::filesystem::__cxx11::path::string((string *)&file,(path *)chainman);
      source_file_02._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
      ;
      source_file_02._M_len = 0x65;
      logging_function_02._M_str = "ImportBlocks";
      logging_function_02._M_len = 0xc;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function_02,source_file_02,0x4e2,ALL,Info,
                 (ConstevalFormatString<1U>)0xc9e383,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file);
      std::__cxx11::string::~string((string *)&file);
    }
    else {
      std::filesystem::__cxx11::path::string((string *)&file,(path *)chainman);
      source_file_01._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
      ;
      source_file_01._M_len = 0x65;
      logging_function_01._M_str = "ImportBlocks";
      logging_function_01._M_len = 0xc;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function_01,source_file_01,0x4db,ALL,Info,
                 (ConstevalFormatString<1U>)0xc9e366,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file);
      std::__cxx11::string::~string((string *)&file);
      ChainstateManager::LoadExternalBlockFile
                ((ChainstateManager *)this,(AutoFile *)&blocks_with_unknown_parent,
                 (FlatFilePos *)0x0,
                 (multimap<uint256,_FlatFilePos,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_FlatFilePos>_>_>
                  *)0x0);
      bVar2 = util::SignalInterrupt::operator_cast_to_bool(*(SignalInterrupt **)(this + 0x720));
      if (bVar2) {
        source_file_03._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
        ;
        source_file_03._M_len = 0x65;
        logging_function_03._M_str = "ImportBlocks";
        logging_function_03._M_len = 0xc;
        LogPrintFormatInternal<char[13]>
                  (logging_function_03,source_file_03,0x4de,ALL,Info,
                   (ConstevalFormatString<1U>)0xc9e333,(char (*) [13])"ImportBlocks");
        AutoFile::~AutoFile((AutoFile *)&blocks_with_unknown_parent);
        goto LAB_0075fb6f;
      }
    }
    AutoFile::~AutoFile((AutoFile *)&blocks_with_unknown_parent);
    chainman = (ChainstateManager *)&chainman->m_last_presync_update;
  }
  args = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
  ;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&blocks_with_unknown_parent,
             &cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
             ,0x4eb,false);
  ChainstateManager::GetAll
            ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)&local_160,
             (ChainstateManager *)this);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&blocks_with_unknown_parent);
  ppCVar6 = local_160._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppCVar6 == local_160._M_impl.super__Vector_impl_data._M_finish) {
LAB_0075fb13:
      std::_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>::~_Vector_base(&local_160);
LAB_0075fb6f:
      ImportingNow::~ImportingNow(&imp);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    blocks_with_unknown_parent._M_t._M_impl._0_8_ = 0;
    blocks_with_unknown_parent._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         &blocks_with_unknown_parent._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    blocks_with_unknown_parent._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    blocks_with_unknown_parent._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)
         ((ulong)blocks_with_unknown_parent._M_t._M_impl.super__Rb_tree_header._M_header._M_left &
         0xffffffffffffff00);
    blocks_with_unknown_parent._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&local_48;
    local_48._M_local_buf[0] = '\0';
    local_178._0_4_ = 0;
    local_178[4] = '\0';
    local_178[5] = '\0';
    local_178[6] = '\0';
    local_178[7] = '\0';
    a_Stack_170[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)args;
    pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_178;
    bVar2 = Chainstate::ActivateBestChain
                      (*ppCVar6,(BlockValidationState *)&blocks_with_unknown_parent,pblock);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_170);
    if (!bVar2) {
      plVar1 = *(long **)(this + 2000);
      _((bilingual_str *)&pos,(ConstevalStringLiteral)0xc9e3ab);
      ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                ((string *)local_120,
                 (ValidationState<BlockValidationResult> *)&blocks_with_unknown_parent);
      tinyformat::format<std::__cxx11::string>
                ((bilingual_str *)&file,(tinyformat *)&pos,(bilingual_str *)local_120,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
      (**(code **)(*plVar1 + 0x40))(plVar1,&file);
      bilingual_str::~bilingual_str((bilingual_str *)&file);
      std::__cxx11::string::~string((string *)local_120);
      bilingual_str::~bilingual_str((bilingual_str *)&pos);
      ValidationState<BlockValidationResult>::~ValidationState
                ((ValidationState<BlockValidationResult> *)&blocks_with_unknown_parent);
      goto LAB_0075fb13;
    }
    ValidationState<BlockValidationResult>::~ValidationState
              ((ValidationState<BlockValidationResult> *)&blocks_with_unknown_parent);
    ppCVar6 = ppCVar6 + 1;
  } while( true );
}

Assistant:

void ImportBlocks(ChainstateManager& chainman, std::span<const fs::path> import_paths)
{
    ImportingNow imp{chainman.m_blockman.m_importing};

    // -reindex
    if (!chainman.m_blockman.m_blockfiles_indexed) {
        int nFile = 0;
        // Map of disk positions for blocks with unknown parent (only used for reindex);
        // parent hash -> child disk position, multiple children can have the same parent.
        std::multimap<uint256, FlatFilePos> blocks_with_unknown_parent;
        while (true) {
            FlatFilePos pos(nFile, 0);
            if (!fs::exists(chainman.m_blockman.GetBlockPosFilename(pos))) {
                break; // No block files left to reindex
            }
            AutoFile file{chainman.m_blockman.OpenBlockFile(pos, true)};
            if (file.IsNull()) {
                break; // This error is logged in OpenBlockFile
            }
            LogPrintf("Reindexing block file blk%05u.dat...\n", (unsigned int)nFile);
            chainman.LoadExternalBlockFile(file, &pos, &blocks_with_unknown_parent);
            if (chainman.m_interrupt) {
                LogPrintf("Interrupt requested. Exit %s\n", __func__);
                return;
            }
            nFile++;
        }
        WITH_LOCK(::cs_main, chainman.m_blockman.m_block_tree_db->WriteReindexing(false));
        chainman.m_blockman.m_blockfiles_indexed = true;
        LogPrintf("Reindexing finished\n");
        // To avoid ending up in a situation without genesis block, re-try initializing (no-op if reindexing worked):
        chainman.ActiveChainstate().LoadGenesisBlock();
    }

    // -loadblock=
    for (const fs::path& path : import_paths) {
        AutoFile file{fsbridge::fopen(path, "rb")};
        if (!file.IsNull()) {
            LogPrintf("Importing blocks file %s...\n", fs::PathToString(path));
            chainman.LoadExternalBlockFile(file);
            if (chainman.m_interrupt) {
                LogPrintf("Interrupt requested. Exit %s\n", __func__);
                return;
            }
        } else {
            LogPrintf("Warning: Could not open blocks file %s\n", fs::PathToString(path));
        }
    }

    // scan for better chains in the block chain database, that are not yet connected in the active best chain

    // We can't hold cs_main during ActivateBestChain even though we're accessing
    // the chainman unique_ptrs since ABC requires us not to be holding cs_main, so retrieve
    // the relevant pointers before the ABC call.
    for (Chainstate* chainstate : WITH_LOCK(::cs_main, return chainman.GetAll())) {
        BlockValidationState state;
        if (!chainstate->ActivateBestChain(state, nullptr)) {
            chainman.GetNotifications().fatalError(strprintf(_("Failed to connect best block (%s)."), state.ToString()));
            return;
        }
    }
    // End scope of ImportingNow
}